

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall
S2Builder::EdgeChainSimplifier::MergeChain
          (EdgeChainSimplifier *this,vector<int,_std::allocator<int>_> *vertices)

{
  pointer *pppVar1;
  vector<int,std::allocator<int>> *pvVar2;
  ulong *puVar3;
  pointer ppVar4;
  iterator iVar5;
  int *piVar6;
  iterator iVar7;
  pair<int,_int> pVar8;
  pair<int,_int> pVar9;
  Iterator piVar10;
  pointer pvVar11;
  pointer piVar12;
  int iVar13;
  pointer piVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  EdgeId e;
  ulong uVar19;
  vector<int,_std::allocator<int>_> *ids_1;
  ostream *poVar20;
  pointer pvVar21;
  EdgeId e_3;
  long lVar22;
  EdgeId e_2;
  int iVar23;
  uint uVar24;
  vector<int,_std::allocator<int>_> *ids;
  vector<int,_std::allocator<int>_> *this_00;
  pair<const_std::pair<int,_int>_*,_const_std::pair<int,_int>_*> pVar25;
  pair<const_std::pair<int,_int>_*,_const_std::pair<int,_int>_*> pVar26;
  InputEdgeId id;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  merged_input_ids;
  vector<int,_std::allocator<int>_> degenerate_ids;
  IdSet local_d0;
  int local_b4;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_b0;
  vector<int,_std::allocator<int>_> *local_a8;
  EdgeChainSimplifier *local_a0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_98;
  pair<int,_int> *local_80;
  vector<int,_std::allocator<int>_> local_78;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (vector<int,_std::allocator<int>_> *)0x0;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (vector<int,_std::allocator<int>_> *)0x0;
  local_98.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  piVar14 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_a8 = vertices;
  if (4 < (ulong)((long)(vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar14)) {
    uVar17 = 1;
    local_a0 = this;
    do {
      iVar13 = piVar14[uVar17 - 1];
      iVar18 = piVar14[uVar17];
      piVar14 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVar4 = (((this->out_).edges_)->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_50 = (ulong)iVar13;
      local_d0.begin_._0_4_ = iVar13;
      local_d0.begin_._4_4_ = iVar18;
      local_58 = uVar17;
      pVar25 = std::
               __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                         (ppVar4 + piVar14[local_50],ppVar4 + piVar14[local_50 + 1],&local_d0);
      local_80 = pVar25.second;
      piVar14 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVar4 = (((this->out_).edges_)->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_d0.begin_._0_4_ = iVar18;
      local_d0.begin_._4_4_ = iVar13;
      pVar26 = std::
               __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                         (ppVar4 + piVar14[iVar18],ppVar4 + piVar14[(long)iVar18 + 1],&local_d0);
      uVar19 = ((long)local_80 - (long)ppVar4) * 0x20000000;
      local_40 = (ulong)((long)pVar25.first - (long)ppVar4) >> 3 | uVar19;
      local_80 = (pair<int,_int> *)(uVar19 >> 0x20);
      ppVar4 = (((this->out_).edges_)->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar17 = ((long)pVar26.second - (long)ppVar4) * 0x20000000;
      local_48 = (ulong)((long)pVar26.first - (long)ppVar4) >> 3 | uVar17;
      local_b0 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)(uVar17 >> 0x20);
      if (local_58 == 1) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::resize(&local_98,
                 (long)((int)(uVar17 >> 0x20) - (int)local_48) +
                 (long)((int)(uVar19 >> 0x20) - (int)local_40));
        pvVar11 = local_98.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (this_00 = local_98.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_00 != pvVar11;
            this_00 = this_00 + 1) {
          std::vector<int,_std::allocator<int>_>::reserve
                    (this_00,((long)(local_a8->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_a8->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_start >> 2) - 1);
        }
      }
      else {
        uVar17 = local_50 + 0x3f;
        if (-1 < (long)local_50) {
          uVar17 = local_50;
        }
        local_38 = 0x800000000000003f;
        if (((this->is_interior_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [((long)uVar17 >> 6) +
              (ulong)((local_50 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (local_50 & 0x3f) & 1) == 0) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_d0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                     ,0x6bd,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_d0.end_,"Check failed: is_interior_[v0] ",0x1f);
          goto LAB_001b1097;
        }
        piVar14 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppVar4 = (((this->out_).edges_)->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_d0.begin_._0_4_ = iVar13;
        local_d0.begin_._4_4_ = iVar13;
        pVar25 = std::
                 __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                           (ppVar4 + piVar14[local_50],ppVar4 + piVar14[local_50 + 1],&local_d0);
        ppVar4 = (((this->out_).edges_)->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar17 = (long)pVar25.second - (long)ppVar4;
        uVar16 = (int)uVar17 * 0x20000000 | (uint)((ulong)((long)pVar25.first - (long)ppVar4) >> 3);
        uVar24 = (uint)(uVar17 >> 3);
        if (uVar16 != uVar24) {
          uVar17 = (ulong)(int)uVar16;
          do {
            IdSetLexicon::id_set
                      (&local_d0,this->g_->input_edge_id_set_lexicon_,
                       (this->g_->input_edge_id_set_ids_->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar17]);
            piVar10 = local_d0.end_;
            for (poVar20 = (ostream *)CONCAT44(local_d0.begin_._4_4_,(int)local_d0.begin_);
                poVar20 != (ostream *)piVar10;
                poVar20 = (ostream *)((long)&poVar20->_vptr_basic_ostream + 4)) {
              local_b4 = *(int *)&poVar20->_vptr_basic_ostream;
              if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_78,
                           (iterator)
                           local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_b4);
              }
              else {
                *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_b4;
                local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar19 = uVar17 + 0x3f;
            if (-1 < (long)uVar17) {
              uVar19 = uVar17;
            }
            puVar3 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     ((long)uVar19 >> 6) +
                     (ulong)((uVar17 & local_38) < 0x8000000000000001) + 0xffffffffffffffff;
            *puVar3 = *puVar3 | 1L << ((byte)uVar17 & 0x3f);
            uVar17 = uVar17 + 1;
          } while ((uint)uVar17 != uVar24);
        }
      }
      uVar17 = 0;
      iVar13 = (int)local_40;
      iVar18 = (int)local_80;
      if (iVar13 != iVar18) {
        uVar19 = (ulong)iVar13;
        uVar17 = 0;
        do {
          IdSetLexicon::id_set
                    (&local_d0,local_a0->g_->input_edge_id_set_lexicon_,
                     (local_a0->g_->input_edge_id_set_ids_->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start[uVar19]);
          piVar10 = local_d0.end_;
          for (poVar20 = (ostream *)CONCAT44(local_d0.begin_._4_4_,(int)local_d0.begin_);
              poVar20 != (ostream *)piVar10;
              poVar20 = (ostream *)((long)&poVar20->_vptr_basic_ostream + 4)) {
            local_b4 = *(int *)&poVar20->_vptr_basic_ostream;
            pvVar2 = (vector<int,std::allocator<int>> *)
                     (local_98.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar17);
            iVar5._M_current = *(int **)(pvVar2 + 8);
            if (iVar5._M_current == *(int **)(pvVar2 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar2,iVar5,&local_b4);
            }
            else {
              *iVar5._M_current = local_b4;
              *(int **)(pvVar2 + 8) = iVar5._M_current + 1;
            }
          }
          uVar15 = uVar19 + 0x3f;
          if (-1 < (long)uVar19) {
            uVar15 = uVar19;
          }
          puVar3 = (local_a0->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   ((long)uVar15 >> 6) +
                   (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
          *puVar3 = *puVar3 | 1L << ((byte)uVar19 & 0x3f);
          uVar17 = uVar17 + 1;
          uVar19 = uVar19 + 1;
        } while (uVar17 != (uint)(iVar18 - iVar13));
      }
      this = local_a0;
      if ((int)local_48 != (int)local_b0) {
        uVar17 = uVar17 & 0xffffffff;
        uVar19 = (ulong)(int)local_48;
        do {
          IdSetLexicon::id_set
                    (&local_d0,this->g_->input_edge_id_set_lexicon_,
                     (this->g_->input_edge_id_set_ids_->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start[uVar19]);
          piVar10 = local_d0.end_;
          for (poVar20 = (ostream *)CONCAT44(local_d0.begin_._4_4_,(int)local_d0.begin_);
              poVar20 != (ostream *)piVar10;
              poVar20 = (ostream *)((long)&poVar20->_vptr_basic_ostream + 4)) {
            local_b4 = *(int *)&poVar20->_vptr_basic_ostream;
            pvVar2 = (vector<int,std::allocator<int>> *)
                     (local_98.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar17);
            iVar5._M_current = *(int **)(pvVar2 + 8);
            if (iVar5._M_current == *(int **)(pvVar2 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar2,iVar5,&local_b4);
            }
            else {
              *iVar5._M_current = local_b4;
              *(int **)(pvVar2 + 8) = iVar5._M_current + 1;
            }
          }
          uVar15 = uVar19 + 0x3f;
          if (-1 < (long)uVar19) {
            uVar15 = uVar19;
          }
          puVar3 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   ((long)uVar15 >> 6) +
                   (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
          *puVar3 = *puVar3 | 1L << ((byte)uVar19 & 0x3f);
          uVar17 = uVar17 + 1;
          uVar19 = uVar19 + 1;
        } while ((int)uVar19 != (int)local_b0);
      }
      if (((long)local_98.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_98.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
          (uVar17 & 0xffffffff) != 0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_d0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                   ,0x6d7,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_d0.end_,"Check failed: (merged_input_ids.size()) == (j) ",0x2f);
LAB_001b1097:
        abort();
      }
      uVar17 = local_58 + 1;
      piVar14 = (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(local_a8->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar14 >> 2))
    ;
  }
  piVar12 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  piVar14 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar17 = (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar22 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar14,piVar12);
    AssignDegenerateEdges(this,&local_78,&local_98);
  }
  piVar6 = (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  iVar13 = *piVar6;
  local_d0.begin_._4_4_ = piVar6[1];
  iVar18 = (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish[-1];
  piVar14 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVar4 = (((this->out_).edges_)->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_a8 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_a8._4_4_,local_d0.begin_._4_4_);
  local_d0.begin_._0_4_ = iVar13;
  pVar25 = std::
           __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                     (ppVar4 + piVar14[iVar13],ppVar4 + piVar14[(long)iVar13 + 1]);
  ppVar4 = (((this->out_).edges_)->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar17 = (long)pVar25.second - (long)ppVar4;
  uVar16 = (int)uVar17 * 0x20000000 | (uint)((ulong)((long)pVar25.first - (long)ppVar4) >> 3);
  iVar23 = (int)(uVar17 >> 3) - uVar16;
  if (iVar23 != 0) {
    local_b0 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->new_edges_;
    lVar22 = (long)(int)uVar16;
    do {
      iVar7._M_current =
           (this->new_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_d0.begin_._4_4_ = iVar18;
      if (iVar7._M_current ==
          (this->new_edges_).
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_d0.begin_._0_4_ = iVar13;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>(local_b0,iVar7,(pair<int,_int> *)&local_d0);
      }
      else {
        pVar8.second = iVar18;
        pVar8.first = iVar13;
        *iVar7._M_current = pVar8;
        pppVar1 = &(this->new_edges_).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      local_d0.begin_._0_4_ =
           (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar22];
      iVar5._M_current =
           (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->new_edge_layers_,iVar5,(int *)&local_d0);
      }
      else {
        *iVar5._M_current = (int)local_d0.begin_;
        (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      lVar22 = lVar22 + 1;
      iVar23 = iVar23 + -1;
    } while (iVar23 != 0);
  }
  piVar14 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVar4 = (((this->out_).edges_)->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_d0.begin_._0_4_ = (int)local_a8;
  local_d0.begin_._4_4_ = iVar13;
  pVar25 = std::
           __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                     (ppVar4 + piVar14[(int)local_a8],ppVar4 + piVar14[(long)(int)local_a8 + 1]);
  ppVar4 = (((this->out_).edges_)->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar17 = (long)pVar25.second - (long)ppVar4;
  uVar16 = (int)uVar17 * 0x20000000 | (uint)((ulong)((long)pVar25.first - (long)ppVar4) >> 3);
  iVar23 = (int)(uVar17 >> 3) - uVar16;
  if (iVar23 != 0) {
    local_b0 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->new_edges_;
    lVar22 = (long)(int)uVar16;
    do {
      iVar7._M_current =
           (this->new_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->new_edges_).
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_d0.begin_._0_4_ = iVar18;
        local_d0.begin_._4_4_ = iVar13;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>(local_b0,iVar7,(pair<int,_int> *)&local_d0);
      }
      else {
        pVar9.second = iVar13;
        pVar9.first = iVar18;
        *iVar7._M_current = pVar9;
        pppVar1 = &(this->new_edges_).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
        local_d0.begin_._4_4_ = iVar13;
      }
      local_d0.begin_._0_4_ =
           (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar22];
      iVar5._M_current =
           (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->new_edge_layers_,iVar5,(int *)&local_d0);
      }
      else {
        *iVar5._M_current = (int)local_d0.begin_;
        (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      lVar22 = lVar22 + 1;
      iVar23 = iVar23 + -1;
    } while (iVar23 != 0);
  }
  pvVar11 = local_98.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar21 = local_98.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_d0.begin_._0_4_ =
           IdSetLexicon::
           Add<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                     (this->input_edge_id_set_lexicon_,
                      (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (pvVar21->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start,
                      (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (pvVar21->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
      iVar5._M_current =
           (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->new_input_edge_ids_,iVar5,(int *)&local_d0);
      }
      else {
        *iVar5._M_current = (int)local_d0.begin_;
        (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      pvVar21 = pvVar21 + 1;
    } while (pvVar21 != pvVar11);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void S2Builder::EdgeChainSimplifier::MergeChain(
    const vector<VertexId>& vertices) {
  // Suppose that all interior vertices have M outgoing edges and N incoming
  // edges.  Our goal is to group the edges into M outgoing chains and N
  // incoming chains, and then replace each chain by a single edge.
  vector<vector<InputEdgeId>> merged_input_ids;
  vector<InputEdgeId> degenerate_ids;
  int num_out;  // Edge count in the outgoing direction.
  for (int i = 1; i < vertices.size(); ++i) {
    VertexId v0 = vertices[i-1];
    VertexId v1 = vertices[i];
    auto out_edges = out_.edge_ids(v0, v1);
    auto in_edges = out_.edge_ids(v1, v0);
    if (i == 1) {
      // Allocate space to store the input edge ids associated with each edge.
      num_out = out_edges.size();
      merged_input_ids.resize(num_out + in_edges.size());
      for (vector<InputEdgeId>& ids : merged_input_ids) {
        ids.reserve(vertices.size() - 1);
      }
    } else {
      // For each interior vertex, we build a list of input edge ids
      // associated with degenerate edges.  Each input edge ids will be
      // assigned to one of the output edges later.  (Normally there are no
      // degenerate edges at all since most layer types don't want them.)
      S2_DCHECK(is_interior_[v0]);
      for (EdgeId e : out_.edge_ids(v0, v0)) {
        for (InputEdgeId id : g_.input_edge_ids(e)) {
          degenerate_ids.push_back(id);
        }
        used_[e] = true;
      }
    }
    // Because the edges were created in layer order, and all sorts used are
    // stable, the edges are still in layer order.  Therefore we can simply
    // merge together all the edges in the same relative position.
    int j = 0;
    for (EdgeId e : out_edges) {
      for (InputEdgeId id : g_.input_edge_ids(e)) {
        merged_input_ids[j].push_back(id);
      }
      used_[e] = true;
      ++j;
    }
    for (EdgeId e : in_edges) {
      for (InputEdgeId id : g_.input_edge_ids(e)) {
        merged_input_ids[j].push_back(id);
      }
      used_[e] = true;
      ++j;
    }
    S2_DCHECK_EQ(merged_input_ids.size(), j);
  }
  if (!degenerate_ids.empty()) {
    std::sort(degenerate_ids.begin(), degenerate_ids.end());
    AssignDegenerateEdges(degenerate_ids, &merged_input_ids);
  }
  // Output the merged edges.
  VertexId v0 = vertices[0], v1 = vertices[1], vb = vertices.back();
  for (EdgeId e : out_.edge_ids(v0, v1)) {
    new_edges_.push_back(Edge(v0, vb));
    new_edge_layers_.push_back(graph_edge_layer(e));
  }
  for (EdgeId e : out_.edge_ids(v1, v0)) {
    new_edges_.push_back(Edge(vb, v0));
    new_edge_layers_.push_back(graph_edge_layer(e));
  }
  for (const auto& ids : merged_input_ids) {
    new_input_edge_ids_.push_back(input_edge_id_set_lexicon_->Add(ids));
  }
}